

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall sfc::Image::Image(Image *this,string *path)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  iterator __position;
  LodePNGColorType LVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *prVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  pointer puVar12;
  uint h;
  uint w;
  rgba_vec_t rgba_v;
  byte_vec_t buffer;
  uint32_t color;
  State state;
  uint local_2e0;
  uint local_2dc;
  channel_vec_t *local_2d8;
  index_vec_t *local_2d0;
  rgba_set_t *local_2c8;
  rgba_vec_t local_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  undefined1 local_288 [8];
  pointer puStack_280;
  _Base_ptr local_278;
  _Base_ptr local_270;
  _Base_ptr p_Stack_268;
  size_t local_260;
  State local_250;
  
  local_2d8 = &this->_data;
  local_2d0 = &this->_indexed_data;
  local_2c8 = &this->_colors;
  p_Var1 = &(this->_colors)._M_t._M_impl.super__Rb_tree_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = lodepng::load_file(&local_2a8,path);
  if (uVar4 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar8 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar7,pcVar8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lodepng::State::State(&local_250);
  local_250.super_LodePNGState.decoder.color_convert = 0;
  local_250.super_LodePNGState.decoder.ignore_crc = 1;
  uVar4 = lodepng::decode(local_2d8,&local_2dc,&local_2e0,&local_250,&local_2a8);
  LVar3 = local_250.super_LodePNGState.info_raw.colortype;
  if (uVar4 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar8 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar7,pcVar8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_250.super_LodePNGState.info_raw.colortype == LCT_PALETTE) {
    if (local_250.super_LodePNGState.info_raw.bitdepth - 1 < 7) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                 (ulong)(local_2e0 * local_2dc),(allocator_type *)&local_2c0);
      puVar12 = (this->_indexed_data).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (this->_indexed_data).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_288;
      (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_280;
      (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_278;
      local_288 = (undefined1  [8])0x0;
      puStack_280 = (pointer)0x0;
      local_278 = (_Base_ptr)0x0;
      if ((puVar12 != (pointer)0x0) &&
         (operator_delete(puVar12,(long)puVar2 - (long)puVar12), local_288 != (undefined1  [8])0x0))
      {
        operator_delete((void *)local_288,(long)local_278 - (long)local_288);
      }
      iVar5 = local_250.super_LodePNGState.info_raw.bitdepth +
              (local_250.super_LodePNGState.info_raw.bitdepth == 0);
      bVar11 = 0;
      do {
        bVar11 = bVar11 * '\x02' + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar5 = 0;
      puVar12 = (this->_indexed_data).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar12) {
        uVar6 = 0;
        do {
          puVar12[uVar6] =
               (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start
               [uVar6 / (8 / (ulong)local_250.super_LodePNGState.info_raw.bitdepth)] >>
               (8 - (((byte)iVar5 & 7) + (char)local_250.super_LodePNGState.info_raw.bitdepth) &
               0x1f) & bVar11;
          puVar12 = (this->_indexed_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (ulong)((int)uVar6 + 1);
          iVar5 = iVar5 + local_250.super_LodePNGState.info_raw.bitdepth;
        } while (uVar6 < (ulong)((long)(this->_indexed_data).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12));
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_2d0,local_2d8);
    }
    if ((local_250.super_LodePNGState.info_raw.palettesize & 0x3fffffffffffffff) != 0) {
      uVar4 = 4;
      uVar10 = 0;
      uVar6 = local_250.super_LodePNGState.info_raw.palettesize;
      do {
        uVar9 = CONCAT13(local_250.super_LodePNGState.info_raw.palette[uVar4 - 1],
                         CONCAT12(local_250.super_LodePNGState.info_raw.palette[uVar4 - 2],
                                  CONCAT11(local_250.super_LodePNGState.info_raw.palette[uVar4 - 3],
                                           local_250.super_LodePNGState.info_raw.palette[uVar10])));
        local_288._0_4_ = uVar9;
        __position._M_current =
             (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_palette,__position
                     ,(uint *)local_288);
          uVar6 = local_250.super_LodePNGState.info_raw.palettesize;
        }
        else {
          *__position._M_current = uVar9;
          (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar10 = (ulong)uVar4;
        uVar4 = uVar4 + 4;
      } while (uVar10 <= uVar6 * 4 && uVar6 * 4 - uVar10 != 0);
    }
    local_250.super_LodePNGState.info_raw.colortype = LCT_RGBA;
  }
  if ((local_250.super_LodePNGState.info_png.color.colortype < 5) &&
     ((0x15U >> (local_250.super_LodePNGState.info_png.color.colortype & 0x1f) & 1) != 0)) {
    local_250.super_LodePNGState.info_raw.colortype = LCT_RGBA;
    if (local_250.super_LodePNGState.info_png.color.bitdepth != 8) {
LAB_00136de5:
      local_250.super_LodePNGState.info_raw.bitdepth = 8;
    }
  }
  else {
    if (local_250.super_LodePNGState.info_png.color.bitdepth != 8) goto LAB_00136de5;
    if (LVar3 != LCT_PALETTE) goto LAB_00136e30;
  }
  puVar12 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar12) {
    (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar12;
  }
  local_250.super_LodePNGState.decoder.color_convert = 1;
  uVar4 = lodepng::decode(local_2d8,&local_2dc,&local_2e0,&local_250,&local_2a8);
  if (uVar4 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar8 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar7,pcVar8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00136e30:
  this->_width = local_2dc;
  this->_height = local_2e0;
  this->_src_coord_x = 0;
  this->_src_coord_y = 0;
  to_rgba(&local_2c0,local_2d8);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)local_288,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&local_2c8->_M_t);
  if (local_278 != (_Base_ptr)0x0) {
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)puStack_280;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_278;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_270;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_268;
    local_278->_M_parent = &p_Var1->_M_header;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_260;
    local_278 = (_Base_ptr)0x0;
    local_260 = 0;
    local_270 = (_Base_ptr)&puStack_280;
    p_Stack_268 = (_Base_ptr)&puStack_280;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_288);
  if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lodepng::State::~State(&local_250);
  if (local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Image::Image(const std::string& path) {
  byte_vec_t buffer;
  unsigned w, h;

  unsigned error = lodepng::load_file(buffer, path);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  lodepng::State state;
  state.decoder.color_convert = false;
  state.decoder.ignore_crc = true;

  error = lodepng::decode(_data, w, h, state, buffer);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  bool needs_conversion = false;

  if (state.info_raw.colortype == LCT_PALETTE) {
    if (state.info_raw.bitdepth && state.info_raw.bitdepth < 8) {
      // unpack 2/4 bit data
      _indexed_data = index_vec_t(w * h);
      unsigned depth = state.info_raw.bitdepth;
      unsigned ppb = 8 / state.info_raw.bitdepth;
      index_t mask = 0;
      for (unsigned i = 0; i < depth; ++i)
        mask = (mask << 1) + 1;

      for (unsigned i = 0; i < _indexed_data.size(); ++i) {
        unsigned pack_shift = 8 - depth - ((i * depth) % 8);
        _indexed_data[i] = mask & (_data[i / ppb] >> pack_shift);
      }

    } else {
      _indexed_data = _data;
    }

    for (unsigned i = 0; i < state.info_raw.palettesize * 4; i += 4) {
      uint32_t color = (state.info_raw.palette[i]) + (state.info_raw.palette[i + 1] << 8) +
                       (state.info_raw.palette[i + 2] << 16) + (state.info_raw.palette[i + 3] << 24);
      _palette.push_back(color);
    }

    needs_conversion = true;
    state.info_raw.colortype = LCT_RGBA;
  }

  if (state.info_png.color.colortype == LCT_RGB || state.info_png.color.colortype == LCT_GREY ||
      state.info_png.color.colortype == LCT_GREY_ALPHA) {
    state.info_raw.colortype = LCT_RGBA;
    needs_conversion = true;
  }

  if (state.info_png.color.bitdepth != 8) {
    state.info_raw.bitdepth = 8;
    needs_conversion = true;
  }

  if (needs_conversion) {
    _data.clear();
    state.decoder.color_convert = true;
    error = lodepng::decode(_data, w, h, state, buffer);
    if (error)
      throw std::runtime_error(lodepng_error_text(error));
  }

  _width = w;
  _height = h;

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}